

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result-c.cpp
# Opt level: O3

void duckdb::WriteData<short,short,duckdb::CStandardConverter>
               (duckdb_column *column,ColumnDataCollection *source,
               vector<unsigned_long,_true> *column_ids)

{
  void *pvVar1;
  data_ptr_t pdVar2;
  idx_t iVar3;
  unsigned_long *puVar4;
  bool bVar5;
  DataChunk *this;
  reference pvVar6;
  ulong uVar7;
  long lVar8;
  ColumnDataChunkIterator __end2;
  ColumnDataChunkIterator __begin2;
  ColumnDataChunkIterationHelper local_1a8;
  void *local_188 [3];
  ColumnDataChunkIterator local_170;
  ColumnDataChunkIterator local_d0;
  
  pvVar1 = column->deprecated_data;
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_188,
             &column_ids->super_vector<unsigned_long,_std::allocator<unsigned_long>_>);
  ColumnDataCollection::Chunks(&local_1a8,source,(vector<unsigned_long,_true> *)local_188);
  if (local_188[0] != (void *)0x0) {
    operator_delete(local_188[0]);
  }
  ColumnDataChunkIterationHelper::begin(&local_d0,&local_1a8);
  ColumnDataChunkIterationHelper::end(&local_170,&local_1a8);
  lVar8 = 0;
  while( true ) {
    bVar5 = ColumnDataChunkIterationHelper::ColumnDataChunkIterator::operator!=
                      (&local_d0,&local_170);
    if (!bVar5) break;
    this = ColumnDataChunkIterationHelper::ColumnDataChunkIterator::operator*(&local_d0);
    pvVar6 = vector<duckdb::Vector,_true>::operator[](&this->data,0);
    pdVar2 = pvVar6->data;
    pvVar6 = vector<duckdb::Vector,_true>::operator[](&this->data,0);
    FlatVector::VerifyFlatVector(pvVar6);
    iVar3 = this->count;
    if (iVar3 != 0) {
      puVar4 = (pvVar6->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      uVar7 = 0;
      do {
        if ((puVar4 == (unsigned_long *)0x0) || ((puVar4[uVar7 >> 6] >> (uVar7 & 0x3f) & 1) != 0)) {
          *(undefined2 *)((long)pvVar1 + uVar7 * 2 + lVar8 * 2) =
               *(undefined2 *)(pdVar2 + uVar7 * 2);
        }
        uVar7 = uVar7 + 1;
      } while (iVar3 != uVar7);
      lVar8 = lVar8 + uVar7;
    }
    ColumnDataChunkIterationHelper::ColumnDataChunkIterator::operator++(&local_d0);
  }
  if (local_170.scan_chunk.internal.
      super___shared_ptr<duckdb::DataChunk,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.scan_chunk.internal.
               super___shared_ptr<duckdb::DataChunk,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_170.scan_state.column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_170.scan_state.column_ids.
                    super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  ::std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&local_170.scan_state);
  if (local_d0.scan_chunk.internal.super___shared_ptr<duckdb::DataChunk,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.scan_chunk.internal.
               super___shared_ptr<duckdb::DataChunk,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_d0.scan_state.column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d0.scan_state.column_ids.
                    super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  ::std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&local_d0.scan_state);
  if (local_1a8.column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1a8.column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>
                    .super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void WriteData(duckdb_column *column, ColumnDataCollection &source, const vector<column_t> &column_ids) {
	idx_t row = 0;
	auto target = (DST *)column->deprecated_data;
	for (auto &input : source.Chunks(column_ids)) {
		auto source = FlatVector::GetData<SRC>(input.data[0]);
		auto &mask = FlatVector::Validity(input.data[0]);

		for (idx_t k = 0; k < input.size(); k++, row++) {
			if (!mask.RowIsValid(k)) {
				OP::template NullConvert<DST>(target[row]);
			} else {
				target[row] = OP::template Convert<SRC, DST>(source[k]);
			}
		}
	}
}